

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_archive_extract(mz_zip_archive *zip_archive,char *dir,
                       _func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  mz_uint mVar1;
  mz_bool mVar2;
  int iVar3;
  uint __mode;
  size_t len;
  char *pcVar4;
  size_t sStack_8c0;
  mz_uint32 xattr;
  size_t filename_size;
  size_t dirlen;
  mz_zip_archive_file_stat info;
  char symlink_to [513];
  char acStack_249 [9];
  char path [513];
  uint local_38;
  mz_uint n;
  mz_uint i;
  int err;
  void *arg_local;
  _func_int_char_ptr_void_ptr *on_extract_local;
  char *dir_local;
  mz_zip_archive *zip_archive_local;
  
  n = 0;
  sStack_8c0 = 0x200;
  memset(acStack_249 + 1,0,0x201);
  memset(&info.m_time,0,0x201);
  filename_size = strlen(dir);
  if (filename_size + 1 < 0x201) {
    memset(&dirlen,0,0x458);
    strncpy(acStack_249 + 1,dir,0x200);
    if ((acStack_249[filename_size] != '/') && (acStack_249[filename_size] != '\\')) {
      acStack_249[filename_size + 1] = '/';
      filename_size = filename_size + 1;
    }
    if (0x200 - filename_size < 0x200) {
      sStack_8c0 = 0x200 - filename_size;
    }
    mVar1 = mz_zip_reader_get_num_files(zip_archive);
    for (local_38 = 0; local_38 < mVar1; local_38 = local_38 + 1) {
      mVar2 = mz_zip_reader_file_stat(zip_archive,local_38,(mz_zip_archive_file_stat *)&dirlen);
      if (mVar2 == 0) {
        n = 0xfffffffd;
        break;
      }
      len = strlen((char *)&info.m_is_encrypted);
      pcVar4 = zip_name_normalize((char *)&info.m_is_encrypted,(char *)&info.m_is_encrypted,len);
      if (pcVar4 == (char *)0x0) {
        n = 0xfffffffe;
        break;
      }
      strncpy(acStack_249 + filename_size + 1,(char *)&info.m_is_encrypted,sStack_8c0);
      n = zip_mkpath(acStack_249 + 1);
      if ((int)n < 0) break;
      if ((((int)(uint)(ushort)info.m_central_dir_ofs >> 8 == 3) ||
          ((int)(uint)(ushort)info.m_central_dir_ofs >> 8 == 0x13)) &&
         ((info.m_uncomp_size._4_4_ & 0x20000000) != 0)) {
        if ((0x200 < info.m_comp_size) ||
           (mVar2 = mz_zip_reader_extract_to_mem_no_alloc
                              (zip_archive,local_38,&info.m_time,0x200,0,(void *)0x0,0), mVar2 == 0)
           ) {
          n = 0xffffffee;
          break;
        }
        symlink_to[info.m_comp_size - 8] = '\0';
        iVar3 = symlink((char *)&info.m_time,acStack_249 + 1);
        if (iVar3 != 0) {
          n = 0xffffffe8;
          break;
        }
      }
      else {
        mVar2 = mz_zip_reader_is_file_a_directory(zip_archive,local_38);
        if ((mVar2 == 0) &&
           (mVar2 = mz_zip_reader_extract_to_file(zip_archive,local_38,acStack_249 + 1,0),
           mVar2 == 0)) {
          n = 0xffffffed;
          break;
        }
        __mode = info.m_uncomp_size._4_4_ >> 0x10;
        if (((__mode != 0) && (__mode < 0x10000)) &&
           (iVar3 = chmod(acStack_249 + 1,__mode), iVar3 < 0)) {
          n = 0xffffffec;
          break;
        }
      }
      if ((on_extract != (_func_int_char_ptr_void_ptr *)0x0) &&
         (iVar3 = (*on_extract)(acStack_249 + 1,arg), iVar3 < 0)) break;
    }
    mVar2 = mz_zip_reader_end(zip_archive);
    if (mVar2 == 0) {
      n = 0xffffffe7;
    }
    zip_archive_local._4_4_ = n;
  }
  else {
    zip_archive_local._4_4_ = 0xfffffffe;
  }
  return zip_archive_local._4_4_;
}

Assistant:

static int zip_archive_extract(mz_zip_archive *zip_archive, const char *dir,
                               int (*on_extract)(const char *filename,
                                                 void *arg),
                               void *arg) {
  int err = 0;
  mz_uint i, n;
  char path[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  char symlink_to[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  mz_zip_archive_file_stat info;
  size_t dirlen = 0, filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));

  dirlen = strlen(dir);
  if (dirlen + 1 > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE) {
    return ZIP_EINVENTNAME;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, dir);
#else
  strncpy(path, dir, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  if (filename_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen) {
    filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen;
  }
  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      err = ZIP_ENOENT;
      goto out;
    }

    if (!zip_name_normalize(info.m_filename, info.m_filename,
                            strlen(info.m_filename))) {
      // Cannot normalize file name;
      err = ZIP_EINVENTNAME;
      goto out;
    }

#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], filename_size, info.m_filename, filename_size);
#else
    strncpy(&path[dirlen], info.m_filename, filename_size);
#endif
    err = zip_mkpath(path);
    if (err < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file,
                               // 0x40 is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE ||
          !mz_zip_reader_extract_to_mem_no_alloc(
              zip_archive, i, symlink_to, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, 0,
              NULL, 0)) {
        err = ZIP_EMEMNOALLOC;
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        err = ZIP_ESYMLINK;
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          err = ZIP_ENOFILE;
          goto out;
        }
      }

#if defined(_MSC_VER) || defined(PS4)
      (void)xattr; // unused
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
        if (CHMOD(path, (mode_t)xattr) < 0) {
          err = ZIP_ENOPERM;
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(zip_archive)) {
    // Cannot end zip reader
    err = ZIP_ECLSZIP;
  }
  return err;
}